

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.cc
# Opt level: O2

VariableIndex __thiscall
dynet::ComputationGraph::add_input
          (ComputationGraph *this,Dim *d,vector<float,_std::allocator<float>_> *pm,Device *device)

{
  InputNode *this_00;
  VariableIndex VVar1;
  VariableIndex new_node_index;
  VariableIndex local_3c;
  InputNode *local_38;
  
  VVar1 = (VariableIndex)
          ((ulong)((long)(this->nodes).
                         super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->nodes).
                        super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 3);
  local_3c = VVar1;
  this_00 = (InputNode *)operator_new(0xa8);
  InputNode::InputNode(this_00,d,pm);
  local_38 = this_00;
  std::vector<dynet::Node*,std::allocator<dynet::Node*>>::emplace_back<dynet::Node*>
            ((vector<dynet::Node*,std::allocator<dynet::Node*>> *)this,(Node **)&local_38);
  (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish[-1]->device = device;
  set_dim_for_new_node(this,&local_3c);
  return VVar1;
}

Assistant:

VariableIndex ComputationGraph::add_input(const Dim& d, const vector<float>& pm, Device *device) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new InputNode(d, pm));
  nodes.back()->device = device;
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}